

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_upb::generator::FieldClass>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_upb::generator::FieldClass>_>_>::iterator,_bool>
* __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,upb::generator::FieldClass>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,upb::generator::FieldClass>>>
::find_or_prepare_insert_non_soo<char_const*>
          (pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_upb::generator::FieldClass>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_upb::generator::FieldClass>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,upb::generator::FieldClass>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,upb::generator::FieldClass>>>
          *this,char **key)

{
  uint *puVar1;
  char *__s;
  ulong uVar2;
  long lVar3;
  ushort uVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char **ppcVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  char cVar30;
  char cVar31;
  char cVar32;
  char cVar33;
  undefined1 uVar34;
  bool bVar35;
  ushort uVar36;
  uint uVar37;
  size_t sVar38;
  uint64_t uVar39;
  size_t sVar40;
  ctrl_t *pcVar41;
  uint uVar42;
  ulong uVar43;
  anon_union_8_1_a8a14541_for_iterator_2 aVar44;
  bool bVar45;
  undefined7 in_register_00000089;
  ulong uVar46;
  uchar *bytes;
  ulong uVar47;
  CommonFields *common;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  FindInfo target;
  __m128i match;
  ulong local_b0;
  _Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
  local_98;
  _Head_base<0UL,_const_upb::generator::FieldClass_&,_false> local_90;
  char **local_88;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,upb::generator::FieldClass>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,upb::generator::FieldClass>>>
  *local_80;
  undefined4 local_78;
  char cStack_74;
  char cStack_73;
  char cStack_72;
  char cStack_71;
  char cStack_70;
  char cStack_6f;
  char cStack_6e;
  char cStack_6d;
  char cStack_6c;
  char cStack_6b;
  char cStack_6a;
  char cStack_69;
  ulong local_60;
  CommonFields *local_58;
  char **local_50;
  undefined1 local_48 [16];
  
  __s = *key;
  local_50 = key;
  sVar38 = strlen(__s);
  uVar39 = hash_internal::MixingHashState::CombineContiguousImpl
                     (&hash_internal::MixingHashState::kSeed,__s,sVar38);
  uVar43 = *(ulong *)this;
  if ((uVar43 + 1 & uVar43) != 0) {
    __assert_fail("(((mask + 1) & mask) == 0 && \"not a mask\") && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x14c,
                  "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]")
    ;
  }
  uVar47 = (uVar39 ^ sVar38) * -0x234dd359734ecb13;
  common = (CommonFields *)
           (uVar47 >> 0x38 | (uVar47 & 0xff000000000000) >> 0x28 | (uVar47 & 0xff0000000000) >> 0x18
            | (uVar47 & 0xff00000000) >> 8 | (uVar47 & 0xff000000) << 8 |
            (uVar47 & 0xff0000) << 0x18 | (uVar47 & 0xff00) << 0x28 | uVar47 << 0x38);
  uVar2 = *(ulong *)(this + 0x10);
  uVar46 = ((ulong)common >> 7 ^ uVar2 >> 0xc) & uVar43;
  uVar34 = (undefined1)(uVar47 >> 0x38);
  auVar48 = ZEXT216(CONCAT11(uVar34,uVar34) & 0x7f7f);
  auVar48 = pshuflw(auVar48,auVar48,0);
  local_48._0_4_ = auVar48._0_4_;
  local_48._4_4_ = local_48._0_4_;
  local_48._8_4_ = local_48._0_4_;
  local_48._12_4_ = local_48._0_4_;
  pcVar41 = (__return_storage_ptr__->first).ctrl_;
  aVar44 = (__return_storage_ptr__->first).field_1;
  bVar45 = __return_storage_ptr__->second;
  local_b0 = 0;
  do {
    puVar1 = (uint *)(uVar2 + uVar46);
    local_78 = *puVar1;
    auVar48[0] = -(local_48[0] == (char)*puVar1);
    auVar48[1] = -(local_48[1] == *(char *)((long)puVar1 + 1));
    auVar48[2] = -(local_48[2] == *(char *)((long)puVar1 + 2));
    auVar48[3] = -(local_48[3] == *(char *)((long)puVar1 + 3));
    auVar48[4] = -(local_48[4] == (char)puVar1[1]);
    auVar48[5] = -(local_48[5] == *(char *)((long)puVar1 + 5));
    auVar48[6] = -(local_48[6] == *(char *)((long)puVar1 + 6));
    auVar48[7] = -(local_48[7] == *(char *)((long)puVar1 + 7));
    auVar48[8] = -(local_48[8] == (char)puVar1[2]);
    auVar48[9] = -(local_48[9] == *(char *)((long)puVar1 + 9));
    auVar48[10] = -(local_48[10] == *(char *)((long)puVar1 + 10));
    auVar48[0xb] = -(local_48[0xb] == *(char *)((long)puVar1 + 0xb));
    auVar48[0xc] = -(local_48[0xc] == (char)puVar1[3]);
    auVar48[0xd] = -(local_48[0xd] == *(char *)((long)puVar1 + 0xd));
    auVar48[0xe] = -(local_48[0xe] == *(char *)((long)puVar1 + 0xe));
    auVar48[0xf] = -(local_48[0xf] == *(char *)((long)puVar1 + 0xf));
    uVar36 = (ushort)(SUB161(auVar48 >> 7,0) & 1) | (ushort)(SUB161(auVar48 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar48 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar48 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar48 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar48 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar48 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar48 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar48 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar48 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar48 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar48 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar48 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar48 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar48 >> 0x77,0) & 1) << 0xe | (ushort)(auVar48[0xf] >> 7) << 0xf;
    uVar42 = (uint)uVar36;
    cVar5 = (char)*puVar1;
    cVar6 = *(char *)((long)puVar1 + 1);
    cVar7 = *(char *)((long)puVar1 + 2);
    cVar8 = *(char *)((long)puVar1 + 3);
    cVar22 = (char)puVar1[1];
    cVar23 = *(char *)((long)puVar1 + 5);
    cVar24 = *(char *)((long)puVar1 + 6);
    cVar25 = *(char *)((long)puVar1 + 7);
    cVar26 = (char)puVar1[2];
    cVar27 = *(char *)((long)puVar1 + 9);
    cVar28 = *(char *)((long)puVar1 + 10);
    cVar29 = *(char *)((long)puVar1 + 0xb);
    cVar30 = (char)puVar1[3];
    cVar31 = *(char *)((long)puVar1 + 0xd);
    cVar32 = *(char *)((long)puVar1 + 0xe);
    cVar33 = *(char *)((long)puVar1 + 0xf);
    ppcVar21 = local_88;
    cVar9 = cStack_74;
    cVar10 = cStack_73;
    cVar11 = cStack_72;
    cVar12 = cStack_71;
    cVar13 = cStack_70;
    cVar14 = cStack_6f;
    cVar15 = cStack_6e;
    cVar16 = cStack_6d;
    cVar17 = cStack_6c;
    cVar18 = cStack_6b;
    cVar19 = cStack_6a;
    cVar20 = cStack_69;
    local_88 = local_50;
    while (cStack_69 = cVar33, cStack_6a = cVar32, cStack_6b = cVar31, cStack_6c = cVar30,
          cStack_6d = cVar29, cStack_6e = cVar28, cStack_6f = cVar27, cStack_70 = cVar26,
          cStack_71 = cVar25, cStack_72 = cVar24, cStack_73 = cVar23, cStack_74 = cVar22,
          local_50 = local_88, uVar36 != 0) {
      uVar37 = 0;
      if (uVar42 != 0) {
        for (; (uVar42 >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
        }
      }
      uVar47 = uVar37 + uVar46 & uVar43;
      local_98._M_head_impl =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (*(long *)(this + 0x18) + uVar47 * 0x28);
      local_90._M_head_impl = (FieldClass *)(*(long *)(this + 0x18) + 0x20 + uVar47 * 0x28);
      local_80 = this;
      local_60 = uVar43;
      local_58 = common;
      bVar35 = EqualElement<char_const*>::operator()
                         ((EqualElement<char_const*> *)&local_88,local_98._M_head_impl,
                          (piecewise_construct_t *)&std::piecewise_construct,
                          (tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                           *)&local_98,(tuple<const_upb::generator::FieldClass_&> *)&local_90);
      if (bVar35) {
        (__return_storage_ptr__->first).field_1 = aVar44;
        __return_storage_ptr__->second = bVar45;
        (__return_storage_ptr__->first).ctrl_ = pcVar41;
        if (*(long *)(this + 0x10) != 0) {
          lVar3 = *(long *)(this + 0x18);
          (__return_storage_ptr__->first).ctrl_ = (ctrl_t *)(*(long *)(this + 0x10) + uVar47);
          (__return_storage_ptr__->first).field_1.slot_ = (slot_type *)(uVar47 * 0x28 + lVar3);
          __return_storage_ptr__->second = false;
          return __return_storage_ptr__;
        }
        goto LAB_00282a65;
      }
      uVar36 = (ushort)(uVar42 - 1) & (ushort)uVar42;
      uVar42 = CONCAT22((short)(uVar42 - 1 >> 0x10),uVar36);
      uVar43 = local_60;
      common = local_58;
      cVar5 = (char)local_78;
      cVar6 = local_78._1_1_;
      cVar7 = local_78._2_1_;
      cVar8 = local_78._3_1_;
      cVar22 = cStack_74;
      cVar23 = cStack_73;
      cVar24 = cStack_72;
      cVar25 = cStack_71;
      cVar26 = cStack_70;
      cVar27 = cStack_6f;
      cVar28 = cStack_6e;
      cVar29 = cStack_6d;
      cVar30 = cStack_6c;
      cVar31 = cStack_6b;
      cVar32 = cStack_6a;
      cVar33 = cStack_69;
      ppcVar21 = local_88;
      cVar9 = cStack_74;
      cVar10 = cStack_73;
      cVar11 = cStack_72;
      cVar12 = cStack_71;
      cVar13 = cStack_70;
      cVar14 = cStack_6f;
      cVar15 = cStack_6e;
      cVar16 = cStack_6d;
      cVar17 = cStack_6c;
      cVar18 = cStack_6b;
      cVar19 = cStack_6a;
      cVar20 = cStack_69;
      local_88 = local_50;
    }
    auVar49[0] = -(cVar5 == -0x80);
    auVar49[1] = -(cVar6 == -0x80);
    auVar49[2] = -(cVar7 == -0x80);
    auVar49[3] = -(cVar8 == -0x80);
    auVar49[4] = -(cStack_74 == -0x80);
    auVar49[5] = -(cStack_73 == -0x80);
    auVar49[6] = -(cStack_72 == -0x80);
    auVar49[7] = -(cStack_71 == -0x80);
    auVar49[8] = -(cStack_70 == -0x80);
    auVar49[9] = -(cStack_6f == -0x80);
    auVar49[10] = -(cStack_6e == -0x80);
    auVar49[0xb] = -(cStack_6d == -0x80);
    auVar49[0xc] = -(cStack_6c == -0x80);
    auVar49[0xd] = -(cStack_6b == -0x80);
    auVar49[0xe] = -(cStack_6a == -0x80);
    auVar49[0xf] = -(cStack_69 == -0x80);
    uVar36 = (ushort)(SUB161(auVar49 >> 7,0) & 1) | (ushort)(SUB161(auVar49 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar49 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar49 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar49 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar49 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar49 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar49 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar49 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar49 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar49 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar49 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar49 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar49 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar49 >> 0x77,0) & 1) << 0xe | (ushort)(auVar49[0xf] >> 7) << 0xf;
    uVar42 = (uint)uVar36;
    local_88 = ppcVar21;
    local_78 = uVar42;
    cStack_74 = cVar9;
    cStack_73 = cVar10;
    cStack_72 = cVar11;
    cStack_71 = cVar12;
    cStack_70 = cVar13;
    cStack_6f = cVar14;
    cStack_6e = cVar15;
    cStack_6d = cVar16;
    cStack_6c = cVar17;
    cStack_6b = cVar18;
    cStack_6a = cVar19;
    cStack_69 = cVar20;
    if (uVar36 == 0) {
      if (*(ulong *)this < local_b0 + 0x10) {
        (__return_storage_ptr__->first).field_1 = aVar44;
        __return_storage_ptr__->second = bVar45;
        (__return_storage_ptr__->first).ctrl_ = pcVar41;
        __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xf7d,
                      "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, upb::generator::FieldClass>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string<char>, upb::generator::FieldClass>>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, upb::generator::FieldClass>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string<char>, upb::generator::FieldClass>>, K = const char *]"
                     );
      }
      uVar46 = uVar46 + local_b0 + 0x10 & uVar43;
      local_b0 = local_b0 + 0x10;
    }
    else {
      uVar34 = bVar45;
      bVar35 = ShouldInsertBackwardsForDebug
                         (*(size_t *)this,(size_t)common,*(ctrl_t **)(this + 0x10));
      if (bVar35) {
        uVar4 = 0xf;
        if (uVar36 != 0) {
          for (; uVar36 >> uVar4 == 0; uVar4 = uVar4 - 1) {
          }
        }
        uVar37 = (ushort)((uVar4 ^ 0xfff0) + 0x11) - 1;
      }
      else {
        uVar37 = 0;
        if (uVar42 != 0) {
          for (; (uVar36 >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
          }
        }
      }
      target.probe_length = (size_t)GetPolicyFunctions()::value;
      target.offset = local_b0;
      sVar40 = PrepareInsertNonSoo((container_internal *)this,common,uVar37 + uVar46 & uVar43,target
                                   ,(PolicyFunctions *)CONCAT71(in_register_00000089,uVar34));
      if (*(long *)(this + 0x10) == 0) {
        (__return_storage_ptr__->first).field_1 = aVar44;
        __return_storage_ptr__->second = bVar45;
        (__return_storage_ptr__->first).ctrl_ = pcVar41;
LAB_00282a65:
        __assert_fail("ctrl != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0x9ef,
                      "absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, upb::generator::FieldClass>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string<char>, upb::generator::FieldClass>>>::iterator::iterator(ctrl_t *, slot_type *, const GenerationType *) [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, upb::generator::FieldClass>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string<char>, upb::generator::FieldClass>>]"
                     );
      }
      pcVar41 = (ctrl_t *)(*(long *)(this + 0x10) + sVar40);
      aVar44.slot_ = (slot_type *)(sVar40 * 0x28 + *(long *)(this + 0x18));
      bVar45 = true;
      ppcVar21 = local_88;
    }
    local_88 = ppcVar21;
    if ((short)local_78 != 0) {
      (__return_storage_ptr__->first).field_1.slot_ = (slot_type *)aVar44;
      __return_storage_ptr__->second = bVar45;
      (__return_storage_ptr__->first).ctrl_ = pcVar41;
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

std::pair<iterator, bool> find_or_prepare_insert_non_soo(const K& key) {
    ABSL_SWISSTABLE_ASSERT(!is_soo());
    prefetch_heap_block();
    auto hash = hash_ref()(key);
    auto seq = probe(common(), hash);
    const ctrl_t* ctrl = control();
    while (true) {
      Group g{ctrl + seq.offset()};
      for (uint32_t i : g.Match(H2(hash))) {
        if (ABSL_PREDICT_TRUE(PolicyTraits::apply(
                EqualElement<K>{key, eq_ref()},
                PolicyTraits::element(slot_array() + seq.offset(i)))))
          return {iterator_at(seq.offset(i)), false};
      }
      auto mask_empty = g.MaskEmpty();
      if (ABSL_PREDICT_TRUE(mask_empty)) {
        size_t target = seq.offset(
            GetInsertionOffset(mask_empty, capacity(), hash, control()));
        return {iterator_at(PrepareInsertNonSoo(common(), hash,
                                                FindInfo{target, seq.index()},
                                                GetPolicyFunctions())),
                true};
      }
      seq.next();
      ABSL_SWISSTABLE_ASSERT(seq.index() <= capacity() && "full table!");
    }
  }